

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O0

int archive_read_extract_cleanup(archive_read *a)

{
  int local_14;
  int ret;
  archive_read *a_local;
  
  local_14 = 0;
  if (a->extract->ad != (archive *)0x0) {
    local_14 = archive_write_free(a->extract->ad);
  }
  free(a->extract);
  a->extract = (archive_read_extract *)0x0;
  return local_14;
}

Assistant:

static int
archive_read_extract_cleanup(struct archive_read *a)
{
	int ret = ARCHIVE_OK;

	if (a->extract->ad != NULL) {
		ret = archive_write_free(a->extract->ad);
	}
	free(a->extract);
	a->extract = NULL;
	return (ret);
}